

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_tf_do_filtering_mt(AV1_COMP *cpi)

{
  ThreadData_conflict *__src;
  int iVar1;
  uint uVar2;
  uint uVar3;
  EncWorkerData *pEVar4;
  ThreadData_conflict *pTVar5;
  AVxWorker *pAVar6;
  undefined1 *puVar7;
  int iVar8;
  MB_MODE_INFO *pMVar9;
  uint32_t *puVar10;
  uint16_t *puVar11;
  void *pvVar12;
  uint8_t *puVar13;
  EncWorkerData *pEVar14;
  AVxWorkerInterface *pAVar15;
  AVxWorker *pAVar16;
  void **ppvVar17;
  long lVar18;
  long lVar19;
  size_t size;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  iVar1 = (cpi->tf_ctx).is_highbitdepth;
  uVar2 = (cpi->mt_info).num_mod_workers[1];
  uVar3 = (cpi->mt_info).num_workers;
  if ((int)uVar2 < (int)uVar3) {
    uVar3 = uVar2;
  }
  uVar21 = (ulong)uVar3;
  (cpi->mt_info).tf_sync.next_tf_row = 0;
  (cpi->mt_info).tf_sync.tf_mt_exit = false;
  if ((int)uVar3 < 1) {
    aom_get_worker_interface();
  }
  else {
    __src = &cpi->td;
    lVar20 = uVar21 - 1;
    pAVar16 = (cpi->mt_info).workers;
    pEVar4 = (cpi->mt_info).tile_thr_data;
    pEVar14 = pEVar4 + lVar20;
    pAVar16[lVar20].hook = tf_worker_hook;
    pAVar16[lVar20].data1 = pEVar14;
    pAVar16[lVar20].data2 = (void *)0x0;
    pEVar4[lVar20].thread_id = (int)lVar20;
    pEVar4[lVar20].start = (int)lVar20;
    pEVar4[lVar20].cpi = cpi;
    if (lVar20 != 0) {
      iVar24 = uVar3 - 2;
      lVar19 = uVar21 * -0x1d0 + 0x1d0;
      lVar18 = uVar21 * 0x1d0 + -0x3a0;
      lVar22 = uVar21 * 0x38 + -0x48;
      lVar25 = lVar20;
      do {
        pTVar5 = pEVar14->original_td;
        pEVar14->td = pTVar5;
        if (pTVar5 != __src) {
          memcpy(pTVar5,__src,0x256b0);
          av1_init_obmc_buffer(&(pEVar14->td->mb).obmc_buffer);
          pTVar5 = pEVar14->td;
          iVar8 = (cpi->tf_ctx).num_pels;
          size = (size_t)iVar8;
          pMVar9 = (MB_MODE_INFO *)aom_calloc(1,0xb0);
          (pTVar5->tf_data).tmp_mbmi = pMVar9;
          puVar10 = (uint32_t *)aom_memalign(0x10,size * 4);
          (pTVar5->tf_data).accum = puVar10;
          puVar11 = (uint16_t *)aom_memalign(0x10,size * 2);
          (pTVar5->tf_data).count = puVar11;
          if (iVar1 == 0) {
            puVar13 = (uint8_t *)aom_memalign(0x20,size);
          }
          else {
            pvVar12 = aom_memalign(0x20,(long)(iVar8 * 2));
            puVar13 = (uint8_t *)((ulong)pvVar12 >> 1);
          }
          (pTVar5->tf_data).pred = puVar13;
          if (((((pTVar5->tf_data).tmp_mbmi == (MB_MODE_INFO *)0x0) ||
               ((pTVar5->tf_data).accum == (uint32_t *)0x0)) ||
              ((pTVar5->tf_data).count == (uint16_t *)0x0)) || (puVar13 == (uint8_t *)0x0)) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Error allocating temporal filter data");
          }
          else {
            (pTVar5->tf_data).diff.sum = 0;
            (pTVar5->tf_data).diff.sse = 0;
          }
        }
        lVar25 = lVar25 + -1;
        pAVar16 = (cpi->mt_info).workers;
        pEVar4 = (cpi->mt_info).tile_thr_data;
        pEVar14 = pEVar4 + lVar25;
        *(code **)((long)pAVar16 + lVar22 + -0x10) = tf_worker_hook;
        *(char **)((long)pAVar16 + lVar22 + -8) = (pEVar4->error_info).detail + lVar18 + -0x20;
        *(undefined8 *)((long)&pAVar16->impl_ + lVar22) = 0;
        *(int *)((long)&pEVar4->thread_id + lVar18) = iVar24;
        *(int *)((long)&pEVar4->start + lVar18) = iVar24;
        *(AV1_COMP **)((pEVar4->error_info).detail + lVar18 + -0x20) = cpi;
        iVar24 = iVar24 + -1;
        lVar19 = lVar19 + 0x1d0;
        lVar18 = lVar18 + -0x1d0;
        lVar22 = lVar22 + -0x38;
      } while (lVar25 != 0);
      pEVar14 = (EncWorkerData *)((long)pEVar4 - lVar19);
    }
    pEVar14->td = __src;
    pAVar15 = aom_get_worker_interface();
    pAVar6 = (cpi->mt_info).workers;
    pAVar16 = pAVar6 + lVar20;
    pAVar6[lVar20].had_error = 0;
    if (lVar20 != 0) {
      lVar25 = uVar21 * -0x38 + 0x38;
      lVar18 = uVar21 * 0x38 + -0x40;
      do {
        (*pAVar15->launch)(pAVar16);
        lVar20 = lVar20 + -1;
        pAVar6 = (cpi->mt_info).workers;
        pAVar16 = pAVar6 + lVar20;
        *(undefined4 *)((long)&pAVar6->impl_ + lVar18) = 0;
        lVar25 = lVar25 + 0x38;
        lVar18 = lVar18 + -0x38;
      } while (lVar20 != 0);
      pAVar16 = (AVxWorker *)((long)pAVar6 - lVar25);
    }
    (*pAVar15->execute)(pAVar16);
  }
  pAVar15 = aom_get_worker_interface();
  pAVar16 = (cpi->mt_info).workers;
  iVar24 = pAVar16->had_error;
  if (iVar24 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar16->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar3) {
    uVar23 = uVar21 + 1;
    lVar20 = uVar21 * 0x38;
    do {
      pAVar6 = (cpi->mt_info).workers;
      iVar8 = (*pAVar15->sync)((AVxWorker *)((long)&pAVar6[-1].impl_ + lVar20));
      if (iVar8 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar6[-1].data1 + lVar20) + 0x18),0x1a0);
        iVar24 = 1;
      }
      uVar23 = uVar23 - 1;
      lVar20 = lVar20 + -0x38;
    } while (2 < uVar23);
  }
  if (iVar24 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar16->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar3) {
    uVar23 = uVar21 + 1;
    ppvVar17 = &(cpi->mt_info).workers[uVar21 - 1].data1;
    do {
      puVar7 = *(undefined1 **)((long)*ppvVar17 + 8);
      if ((ThreadData_conflict *)puVar7 != &cpi->td) {
        lVar20 = *(long *)(puVar7 + 0x25d98);
        lVar25 = (cpi->td).tf_data.diff.sse;
        (cpi->td).tf_data.diff.sum = (cpi->td).tf_data.diff.sum + *(long *)(puVar7 + 0x25d90);
        (cpi->td).tf_data.diff.sse = lVar25 + lVar20;
      }
      uVar23 = uVar23 - 1;
      ppvVar17 = ppvVar17 + -7;
    } while (1 < uVar23);
    uVar23 = uVar21 + 1;
    lVar20 = uVar21 * 0x1d0 + -0x1c8;
    do {
      puVar7 = *(undefined1 **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar20 + -0x20);
      if ((ThreadData_conflict *)puVar7 != &cpi->td) {
        if (iVar1 != 0) {
          *(long *)(puVar7 + 0x25db8) = *(long *)(puVar7 + 0x25db8) << 1;
        }
        aom_free(*(void **)(puVar7 + 0x25da0));
        *(undefined8 *)(puVar7 + 0x25da0) = 0;
        aom_free(*(void **)(puVar7 + 0x25da8));
        *(undefined8 *)(puVar7 + 0x25da8) = 0;
        aom_free(*(void **)(puVar7 + 0x25db0));
        *(undefined8 *)(puVar7 + 0x25db0) = 0;
        aom_free(*(void **)(puVar7 + 0x25db8));
        *(undefined8 *)(puVar7 + 0x25db8) = 0;
      }
      uVar23 = uVar23 - 1;
      lVar20 = lVar20 + -0x1d0;
    } while (1 < uVar23);
  }
  return;
}

Assistant:

void av1_tf_do_filtering_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  const int is_highbitdepth = cpi->tf_ctx.is_highbitdepth;

  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TF], mt_info->num_workers);

  prepare_tf_workers(cpi, tf_worker_hook, num_workers, is_highbitdepth);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  tf_accumulate_frame_diff(cpi, num_workers);
  tf_dealloc_thread_data(cpi, num_workers, is_highbitdepth);
}